

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O1

int __thiscall ncnn::Convolution::load_model(Convolution *this,ModelBin *mb)

{
  Mat *pMVar1;
  Mat *pMVar2;
  int *piVar3;
  void *pvVar4;
  Allocator *pAVar5;
  size_t sVar6;
  Layer *pLVar7;
  Option *pOVar8;
  long lVar9;
  bool bVar10;
  Mat int8_weight_data;
  ParamDict pd;
  Mat local_598;
  float local_55c;
  ModelBinFromMatArray local_558;
  undefined1 local_548 [8];
  int *piStack_540;
  size_t local_538;
  Allocator *local_530;
  int local_528;
  int iStack_524;
  int iStack_520;
  int iStack_51c;
  Allocator *local_518 [157];
  
  (**mb->_vptr_ModelBin)(local_548,mb,(ulong)(uint)this->weight_data_size,0);
  pMVar1 = &this->weight_data;
  if (pMVar1 != (Mat *)local_548) {
    if (piStack_540 != (int *)0x0) {
      LOCK();
      *piStack_540 = *piStack_540 + 1;
      UNLOCK();
    }
    piVar3 = (this->weight_data).refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar4 = (this->weight_data).data;
        pAVar5 = (this->weight_data).allocator;
        if (pAVar5 == (Allocator *)0x0) {
          if (pvVar4 != (void *)0x0) {
            free(*(void **)((long)pvVar4 + -8));
          }
        }
        else {
          (**(code **)(*(long *)pAVar5 + 8))();
        }
      }
    }
    pMVar1->data = (void *)0x0;
    (this->weight_data).refcount = (int *)0x0;
    (this->weight_data).elemsize = 0;
    (this->weight_data).cstep = 0;
    (this->weight_data).dims = 0;
    (this->weight_data).w = 0;
    (this->weight_data).h = 0;
    (this->weight_data).c = 0;
    (this->weight_data).data = (void *)local_548;
    (this->weight_data).refcount = piStack_540;
    (this->weight_data).elemsize = local_538;
    (this->weight_data).allocator = local_530;
    (this->weight_data).dims = local_528;
    (this->weight_data).w = iStack_524;
    (this->weight_data).h = iStack_520;
    (this->weight_data).c = iStack_51c;
    (this->weight_data).cstep = (size_t)local_518[0];
  }
  if (piStack_540 != (int *)0x0) {
    LOCK();
    *piStack_540 = *piStack_540 + -1;
    UNLOCK();
    if (*piStack_540 == 0) {
      if (local_530 == (Allocator *)0x0) {
        if (local_548 != (undefined1  [8])0x0) {
          free(*(void **)((long)local_548 + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_530 + 8))();
      }
    }
  }
  if (pMVar1->data == (void *)0x0) {
    return -100;
  }
  if ((long)(this->weight_data).c * (this->weight_data).cstep == 0) {
    return -100;
  }
  if (this->bias_term != 0) {
    (**mb->_vptr_ModelBin)(local_548,mb,(ulong)(uint)this->num_output,1);
    pMVar2 = &this->bias_data;
    if (pMVar2 != (Mat *)local_548) {
      if (piStack_540 != (int *)0x0) {
        LOCK();
        *piStack_540 = *piStack_540 + 1;
        UNLOCK();
      }
      piVar3 = (this->bias_data).refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pvVar4 = (this->bias_data).data;
          pAVar5 = (this->bias_data).allocator;
          if (pAVar5 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(*(void **)((long)pvVar4 + -8));
            }
          }
          else {
            (**(code **)(*(long *)pAVar5 + 8))();
          }
        }
      }
      pMVar2->data = (void *)0x0;
      (this->bias_data).refcount = (int *)0x0;
      (this->bias_data).elemsize = 0;
      (this->bias_data).cstep = 0;
      (this->bias_data).dims = 0;
      (this->bias_data).w = 0;
      (this->bias_data).h = 0;
      (this->bias_data).c = 0;
      (this->bias_data).data = (void *)local_548;
      (this->bias_data).refcount = piStack_540;
      (this->bias_data).elemsize = local_538;
      (this->bias_data).allocator = local_530;
      (this->bias_data).dims = local_528;
      (this->bias_data).w = iStack_524;
      (this->bias_data).h = iStack_520;
      (this->bias_data).c = iStack_51c;
      (this->bias_data).cstep = (size_t)local_518[0];
    }
    if (piStack_540 != (int *)0x0) {
      LOCK();
      *piStack_540 = *piStack_540 + -1;
      UNLOCK();
      if (*piStack_540 == 0) {
        if (local_530 == (Allocator *)0x0) {
          if (local_548 != (undefined1  [8])0x0) {
            free(*(void **)((long)local_548 + -8));
          }
        }
        else {
          (**(code **)(*(long *)local_530 + 8))();
        }
      }
    }
    if (pMVar2->data == (void *)0x0) {
      return -100;
    }
    if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
      return -100;
    }
  }
  if (this->int8_scale_term != 0) {
    (**mb->_vptr_ModelBin)(local_548,mb,1,1);
    this->weight_data_int8_scale = *(float *)local_548;
    if (piStack_540 != (int *)0x0) {
      LOCK();
      *piStack_540 = *piStack_540 + -1;
      UNLOCK();
      if (*piStack_540 == 0) {
        if (local_530 == (Allocator *)0x0) {
          if (local_548 != (undefined1  [8])0x0) {
            free(*(void **)((long)local_548 + -8));
          }
        }
        else {
          (**(code **)(*(long *)local_530 + 8))();
        }
      }
    }
    (**mb->_vptr_ModelBin)(local_548,mb,1,1);
    this->bottom_blob_int8_scale = *(float *)local_548;
    if (piStack_540 != (int *)0x0) {
      LOCK();
      *piStack_540 = *piStack_540 + -1;
      UNLOCK();
      if (*piStack_540 == 0) {
        if (local_530 == (Allocator *)0x0) {
          if (local_548 != (undefined1  [8])0x0) {
            free(*(void **)((long)local_548 + -8));
          }
        }
        else {
          (**(code **)(*(long *)local_530 + 8))();
        }
      }
    }
  }
  sVar6 = (this->weight_data).elemsize;
  if (sVar6 == 4) {
    if (this->use_int8_inference == true) {
      pLVar7 = create_layer(0x39);
      ParamDict::ParamDict((ParamDict *)local_548);
      ParamDict::set((ParamDict *)local_548,0,this->weight_data_int8_scale);
      (*pLVar7->_vptr_Layer[2])(pLVar7,local_548);
      local_598.dims = 0;
      local_598.w = 0;
      local_598.h = 0;
      local_598.c = 0;
      local_598.elemsize = 0;
      local_598.allocator = (Allocator *)0x0;
      local_598.data = (void *)0x0;
      local_598.refcount = (int *)0x0;
      local_598.cstep = 0;
      pOVar8 = get_default_option();
      (*pLVar7->_vptr_Layer[5])(pLVar7,pMVar1,&local_598,pOVar8);
      (*pLVar7->_vptr_Layer[1])(pLVar7);
      if (local_598.data == (void *)0x0) {
        bVar10 = true;
      }
      else {
        bVar10 = (long)local_598.c * local_598.cstep == 0;
      }
      if (bVar10) {
        if (local_598.refcount != (int *)0x0) {
          LOCK();
          *local_598.refcount = *local_598.refcount + -1;
          UNLOCK();
          if (*local_598.refcount == 0) {
            if (local_598.allocator == (Allocator *)0x0) {
              if (local_598.data != (void *)0x0) {
                free(*(void **)((long)local_598.data + -8));
              }
            }
            else {
              (**(code **)(*(long *)local_598.allocator + 8))();
            }
          }
        }
        lVar9 = 0x4d8;
        do {
          piVar3 = *(int **)((long)&piStack_540 + lVar9);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (*(long **)((long)&local_530 + lVar9) == (long *)0x0) {
                if (*(long *)(local_548 + lVar9) != 0) {
                  free(*(void **)(*(long *)(local_548 + lVar9) + -8));
                }
              }
              else {
                (**(code **)(**(long **)((long)&local_530 + lVar9) + 8))();
              }
            }
          }
          *(undefined8 *)(local_548 + lVar9) = 0;
          *(undefined8 *)((long)&piStack_540 + lVar9) = 0;
          *(undefined8 *)((long)&local_538 + lVar9) = 0;
          *(undefined8 *)((long)local_518 + lVar9) = 0;
          *(undefined8 *)((long)&local_528 + lVar9) = 0;
          *(undefined8 *)((long)&iStack_520 + lVar9) = 0;
          lVar9 = lVar9 + -0x40;
        } while (lVar9 != -0x28);
        return -100;
      }
      if (pMVar1 != &local_598) {
        if (local_598.refcount != (int *)0x0) {
          LOCK();
          *local_598.refcount = *local_598.refcount + 1;
          UNLOCK();
        }
        piVar3 = (this->weight_data).refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            pvVar4 = (this->weight_data).data;
            pAVar5 = (this->weight_data).allocator;
            if (pAVar5 == (Allocator *)0x0) {
              if (pvVar4 != (void *)0x0) {
                free(*(void **)((long)pvVar4 + -8));
              }
            }
            else {
              (**(code **)(*(long *)pAVar5 + 8))();
            }
          }
        }
        pMVar1->data = (void *)0x0;
        (this->weight_data).refcount = (int *)0x0;
        (this->weight_data).elemsize = 0;
        (this->weight_data).cstep = 0;
        (this->weight_data).dims = 0;
        (this->weight_data).w = 0;
        (this->weight_data).h = 0;
        (this->weight_data).c = 0;
        (this->weight_data).data = local_598.data;
        (this->weight_data).refcount = local_598.refcount;
        (this->weight_data).elemsize = local_598.elemsize;
        (this->weight_data).allocator = local_598.allocator;
        (this->weight_data).dims = local_598.dims;
        (this->weight_data).w = local_598.w;
        (this->weight_data).h = local_598.h;
        (this->weight_data).c = local_598.c;
        (this->weight_data).cstep = local_598.cstep;
      }
      if (local_598.refcount != (int *)0x0) {
        LOCK();
        *local_598.refcount = *local_598.refcount + -1;
        UNLOCK();
        if (*local_598.refcount == 0) {
          if (local_598.allocator == (Allocator *)0x0) {
            if (local_598.data != (void *)0x0) {
              free(*(void **)((long)local_598.data + -8));
            }
          }
          else {
            (**(code **)(*(long *)local_598.allocator + 8))();
          }
        }
      }
      lVar9 = 0x4d8;
      do {
        piVar3 = *(int **)((long)&piStack_540 + lVar9);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (*(long **)((long)&local_530 + lVar9) == (long *)0x0) {
              if (*(long *)(local_548 + lVar9) != 0) {
                free(*(void **)(*(long *)(local_548 + lVar9) + -8));
              }
            }
            else {
              (**(code **)(**(long **)((long)&local_530 + lVar9) + 8))();
            }
          }
        }
        *(undefined8 *)(local_548 + lVar9) = 0;
        *(undefined8 *)((long)&piStack_540 + lVar9) = 0;
        *(undefined8 *)((long)&local_538 + lVar9) = 0;
        *(undefined8 *)((long)local_518 + lVar9) = 0;
        *(undefined8 *)((long)&local_528 + lVar9) = 0;
        *(undefined8 *)((long)&iStack_520 + lVar9) = 0;
        lVar9 = lVar9 + -0x40;
      } while (lVar9 != -0x28);
      if (bVar10) {
        return -100;
      }
    }
  }
  else if ((sVar6 == 1) && (this->use_int8_inference == false)) {
    load_model();
    return -1;
  }
  if (this->use_int8_inference == true) {
    pLVar7 = create_layer(0x39);
    this->quantize = pLVar7;
    ParamDict::ParamDict((ParamDict *)local_548);
    ParamDict::set((ParamDict *)local_548,0,this->bottom_blob_int8_scale);
    (*this->quantize->_vptr_Layer[2])();
    lVar9 = 0x4d8;
    do {
      piVar3 = *(int **)((long)&piStack_540 + lVar9);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (*(long **)((long)&local_530 + lVar9) == (long *)0x0) {
            if (*(long *)(local_548 + lVar9) != 0) {
              free(*(void **)(*(long *)(local_548 + lVar9) + -8));
            }
          }
          else {
            (**(code **)(**(long **)((long)&local_530 + lVar9) + 8))();
          }
        }
      }
      *(undefined8 *)(local_548 + lVar9) = 0;
      *(undefined8 *)((long)&piStack_540 + lVar9) = 0;
      *(undefined8 *)((long)&local_538 + lVar9) = 0;
      *(undefined8 *)((long)local_518 + lVar9) = 0;
      *(undefined8 *)((long)&local_528 + lVar9) = 0;
      *(undefined8 *)((long)&iStack_520 + lVar9) = 0;
      lVar9 = lVar9 + -0x40;
    } while (lVar9 != -0x28);
    pLVar7 = create_layer(0x3a);
    this->dequantize = pLVar7;
    local_55c = 1.0 / (this->weight_data_int8_scale * this->bottom_blob_int8_scale);
    ParamDict::ParamDict((ParamDict *)local_548);
    ParamDict::set((ParamDict *)local_548,0,local_55c);
    ParamDict::set((ParamDict *)local_548,1,this->bias_term);
    ParamDict::set((ParamDict *)local_548,2,this->num_output);
    (*this->dequantize->_vptr_Layer[2])(this->dequantize,local_548);
    local_598.dims = 0;
    local_598.w = 0;
    local_598.h = 0;
    local_598.c = 0;
    local_598.elemsize = 0;
    local_598.allocator = (Allocator *)0x0;
    local_598.data = (void *)0x0;
    local_598.refcount = (int *)0x0;
    local_598.cstep = 0;
    if (&local_598 != &this->bias_data) {
      piVar3 = (this->bias_data).refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      local_598.data = (this->bias_data).data;
      local_598.refcount = (this->bias_data).refcount;
      local_598.elemsize = (this->bias_data).elemsize;
      local_598.allocator = (this->bias_data).allocator;
      local_598.dims = (this->bias_data).dims;
      local_598.w = (this->bias_data).w;
      local_598.h = (this->bias_data).h;
      local_598.c = (this->bias_data).c;
      local_598.cstep = (this->bias_data).cstep;
    }
    pLVar7 = this->dequantize;
    ModelBinFromMatArray::ModelBinFromMatArray(&local_558,&local_598);
    (*pLVar7->_vptr_Layer[3])(pLVar7,&local_558);
    if (local_598.refcount != (int *)0x0) {
      LOCK();
      *local_598.refcount = *local_598.refcount + -1;
      UNLOCK();
      if (*local_598.refcount == 0) {
        if (local_598.allocator == (Allocator *)0x0) {
          if (local_598.data != (void *)0x0) {
            free(*(void **)((long)local_598.data + -8));
          }
        }
        else {
          (**(code **)(*(long *)local_598.allocator + 8))();
        }
      }
    }
    lVar9 = 0x4d8;
    do {
      piVar3 = *(int **)((long)&piStack_540 + lVar9);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (*(long **)((long)&local_530 + lVar9) == (long *)0x0) {
            if (*(long *)(local_548 + lVar9) != 0) {
              free(*(void **)(*(long *)(local_548 + lVar9) + -8));
            }
          }
          else {
            (**(code **)(**(long **)((long)&local_530 + lVar9) + 8))();
          }
        }
      }
      *(undefined8 *)(local_548 + lVar9) = 0;
      *(undefined8 *)((long)&piStack_540 + lVar9) = 0;
      *(undefined8 *)((long)&local_538 + lVar9) = 0;
      *(undefined8 *)((long)local_518 + lVar9) = 0;
      *(undefined8 *)((long)&local_528 + lVar9) = 0;
      *(undefined8 *)((long)&iStack_520 + lVar9) = 0;
      lVar9 = lVar9 + -0x40;
    } while (lVar9 != -0x28);
  }
  return 0;
}

Assistant:

int Convolution::load_model(const ModelBin& mb)
{
    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

    if (int8_scale_term)
    {
        weight_data_int8_scale = mb.load(1, 1)[0];
        bottom_blob_int8_scale = mb.load(1, 1)[0];
    }

    bool weight_data_is_int8 = (weight_data.elemsize == (size_t)1u);
    bool weight_data_is_float32 = (weight_data.elemsize == (size_t)4u);

    if (weight_data_is_int8 && !use_int8_inference)
    {
        fprintf(stderr, "quantized int8 weight loaded but use_int8_inference disabled\n");
        return -1;
    }

    if (weight_data_is_float32 && use_int8_inference)
    {
        // quantize weight to int8
        Layer* op = ncnn::create_layer(ncnn::LayerType::Quantize);

        ncnn::ParamDict pd;
        pd.set(0, weight_data_int8_scale);// scale

        op->load_param(pd);

        Mat int8_weight_data;
        op->forward(weight_data, int8_weight_data);

        delete op;

        if (int8_weight_data.empty())
            return -100;

        weight_data = int8_weight_data;
    }

    if (use_int8_inference)
    {
        quantize = ncnn::create_layer(ncnn::LayerType::Quantize);
        {
            ncnn::ParamDict pd;
            pd.set(0, bottom_blob_int8_scale);// scale

            quantize->load_param(pd);
        }

        dequantize = ncnn::create_layer(ncnn::LayerType::Dequantize);
        {
            float top_rescale = 1.f / (bottom_blob_int8_scale * weight_data_int8_scale);

            ncnn::ParamDict pd;
            pd.set(0, top_rescale);// scale
            pd.set(1, bias_term);// bias_term
            pd.set(2, num_output);// bias_data_size

            dequantize->load_param(pd);

            ncnn::Mat weights[1];
            weights[0] = bias_data;

            dequantize->load_model(ModelBinFromMatArray(weights));
        }
    }

    return 0;
}